

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::LegacyReporterAdapter::assertionEnded
          (LegacyReporterAdapter *this,AssertionStats *assertionStats)

{
  bool *__return_storage_ptr__;
  pointer pMVar1;
  IReporter *pIVar2;
  pointer pMVar3;
  undefined1 local_390 [8];
  ResultBuilder rb;
  AssertionResult result;
  
  if ((assertionStats->assertionResult).m_resultData.resultType != Ok) {
    pMVar3 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar1 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar3 != pMVar1) {
      __return_storage_ptr__ = &rb.m_shouldDebugBreak;
      do {
        if (pMVar3->type == Info) {
          ResultBuilder::ResultBuilder
                    ((ResultBuilder *)local_390,(pMVar3->macroName)._M_dataplus._M_p,
                     &pMVar3->lineInfo,"",Normal,"");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(rb.m_exprComponents.op.field_2._M_local_buf + 8),
                     (pMVar3->message)._M_dataplus._M_p,(pMVar3->message)._M_string_length);
          rb.m_data.message.field_2._8_4_ = 1;
          ResultBuilder::build((AssertionResult *)__return_storage_ptr__,(ResultBuilder *)local_390)
          ;
          pIVar2 = (this->m_legacyReporter).m_p;
          (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
                    (pIVar2,__return_storage_ptr__);
          AssertionResult::~AssertionResult((AssertionResult *)__return_storage_ptr__);
          ResultBuilder::~ResultBuilder((ResultBuilder *)local_390);
        }
        pMVar3 = pMVar3 + 1;
      } while (pMVar3 != pMVar1);
    }
  }
  pIVar2 = (this->m_legacyReporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
            (pIVar2,&assertionStats->assertionResult);
  return true;
}

Assistant:

bool LegacyReporterAdapter::assertionEnded(AssertionStats const& assertionStats) {
		if (assertionStats.assertionResult.getResultType() != ResultWas::Ok) {
			for (std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
				it != itEnd;
				++it) {
				if (it->type == ResultWas::Info) {
					ResultBuilder rb(it->macroName.c_str(), it->lineInfo, "", ResultDisposition::Normal);
					rb << it->message;
					rb.setResultType(ResultWas::Info);
					AssertionResult result = rb.build();
					m_legacyReporter->Result(result);
				}
			}
		}
		m_legacyReporter->Result(assertionStats.assertionResult);
		return true;
	}